

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariantanimation.cpp
# Opt level: O1

void __thiscall
QVariantAnimationPrivate::recalculateCurrentInterval(QVariantAnimationPrivate *this,bool force)

{
  double dVar1;
  int iVar2;
  pair<double,_QVariant> *ppVar3;
  ulong uVar4;
  parameter_type pVar5;
  parameter_type pVar6;
  parameter_type this_00;
  difference_type __d;
  ulong uVar7;
  pair<double,_QVariant> *ppVar8;
  QVariant *variant;
  long in_FS_OFFSET;
  qreal qVar9;
  anon_union_24_3_e3d07ef4_for_data local_78;
  undefined8 local_60;
  double local_58;
  anon_union_24_3_e3d07ef4_for_data local_50;
  undefined8 local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->keyValues).d.size + 1) -
      (ulong)(*(ulong *)&(this->defaultStartEndValue).d.field_0x18 < 4) < 2) goto LAB_003bc0ae;
  pVar5 = QObjectCompatProperty<QAbstractAnimationPrivate,_QAbstractAnimation::Direction,_&QAbstractAnimationPrivate::_qt_property_direction_offset,_&QAbstractAnimationPrivate::setDirection,_&QAbstractAnimationPrivate::emitDirectionChanged,_nullptr>
          ::value(&(this->super_QAbstractAnimationPrivate).direction);
  this_00 = QObjectCompatProperty<QVariantAnimationPrivate,_QEasingCurve,_&QVariantAnimationPrivate::_qt_property_easing_offset,_&QVariantAnimationPrivate::setEasingCurve,_nullptr,_nullptr>
            ::value(&this->easing);
  pVar6 = QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
          ::value(&this->duration);
  if (pVar6 == 0) {
    if (pVar5 == Forward) {
      qVar9 = 1.0;
    }
    else {
      qVar9 = 0.0;
    }
  }
  else {
    iVar2 = (this->super_QAbstractAnimationPrivate).currentTime;
    pVar6 = QObjectCompatProperty<QVariantAnimationPrivate,_int,_&QVariantAnimationPrivate::_qt_property_duration_offset,_&QVariantAnimationPrivate::setDuration,_nullptr,_nullptr>
            ::value(&this->duration);
    qVar9 = (double)iVar2 / (double)pVar6;
  }
  qVar9 = QEasingCurve::valueForProgress(this_00,qVar9);
  if (((force) || ((dVar1 = (this->currentInterval).start.first, 0.0 < dVar1 && (qVar9 < dVar1))))
     || ((dVar1 = (this->currentInterval).end.first, dVar1 < 1.0 && (dVar1 < qVar9)))) {
    ppVar8 = (this->keyValues).d.ptr;
    local_78.shared = (PrivateShared *)0x0;
    local_78._8_8_ = 0;
    local_50.shared = (PrivateShared *)0x0;
    local_50._8_8_ = 0;
    local_50._16_8_ = 0;
    local_38 = 2;
    local_78._16_8_ = 0;
    local_60 = 2;
    uVar7 = (this->keyValues).d.size;
    while (uVar4 = uVar7, 0 < (long)uVar4) {
      uVar7 = uVar4 >> 1;
      if (ppVar8[uVar7].first <= qVar9 && qVar9 != ppVar8[uVar7].first) {
        ppVar8 = ppVar8 + uVar7 + 1;
        uVar7 = ~uVar7 + uVar4;
      }
    }
    local_58 = qVar9;
    ::QVariant::~QVariant((QVariant *)&local_50);
    ::QVariant::~QVariant((QVariant *)&local_78);
    ppVar3 = (this->keyValues).d.ptr;
    if (ppVar8 == ppVar3) {
      dVar1 = ppVar8->first;
      if (((dVar1 != 0.0) || (NAN(dVar1))) || ((ulong)(this->keyValues).d.size < 2)) {
        local_58 = 0.0;
        ::QVariant::QVariant((QVariant *)&local_50,&this->defaultStartEndValue);
        (this->currentInterval).start.first = local_58;
        ::QVariant::operator=(&(this->currentInterval).start.second,(QVariant *)&local_50);
        ::QVariant::~QVariant((QVariant *)&local_50);
        goto LAB_003bc078;
      }
      (this->currentInterval).start.first = dVar1;
      ::QVariant::operator=(&(this->currentInterval).start.second,&ppVar8->second);
      (this->currentInterval).end.first = ppVar8[1].first;
      variant = &ppVar8[1].second;
LAB_003bc089:
      ::QVariant::operator=(&(this->currentInterval).end.second,variant);
    }
    else {
      uVar7 = (this->keyValues).d.size;
      if (ppVar8 != ppVar3 + uVar7) {
        (this->currentInterval).start.first = ppVar8[-1].first;
        ::QVariant::operator=(&(this->currentInterval).start.second,&ppVar8[-1].second);
LAB_003bc078:
        (this->currentInterval).end.first = ppVar8->first;
        variant = &ppVar8->second;
        goto LAB_003bc089;
      }
      dVar1 = ppVar8[-1].first;
      if (((dVar1 == 1.0) && (!NAN(dVar1))) && (1 < uVar7)) {
        (this->currentInterval).start.first = ppVar8[-2].first;
        ::QVariant::operator=(&(this->currentInterval).start.second,&ppVar8[-2].second);
        (this->currentInterval).end.first = ppVar8[-1].first;
        variant = &ppVar8[-1].second;
        goto LAB_003bc089;
      }
      (this->currentInterval).start.first = dVar1;
      ::QVariant::operator=(&(this->currentInterval).start.second,&ppVar8[-1].second);
      local_58 = 1.0;
      ::QVariant::QVariant((QVariant *)&local_50,&this->defaultStartEndValue);
      (this->currentInterval).end.first = local_58;
      ::QVariant::operator=(&(this->currentInterval).end.second,(QVariant *)&local_50);
      ::QVariant::~QVariant((QVariant *)&local_50);
    }
    updateInterpolator(this);
  }
  setCurrentValueForProgress(this,qVar9);
LAB_003bc0ae:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QVariantAnimationPrivate::recalculateCurrentInterval(bool force/*=false*/)
{
    // can't interpolate if we don't have at least 2 values
    if ((keyValues.size() + (defaultStartEndValue.isValid() ? 1 : 0)) < 2)
        return;

    const qreal endProgress = (direction == QAbstractAnimation::Forward) ? qreal(1) : qreal(0);
    const qreal progress = easing.value().valueForProgress(
            duration == 0 ? endProgress : qreal(currentTime) / qreal(duration));

    //0 and 1 are still the boundaries
    if (force || (currentInterval.start.first > 0 && progress < currentInterval.start.first)
        || (currentInterval.end.first < 1 && progress > currentInterval.end.first)) {
        //let's update currentInterval
        QVariantAnimation::KeyValues::const_iterator it = std::lower_bound(keyValues.constBegin(),
                                                                           keyValues.constEnd(),
                                                                           std::pair{progress, QVariant{}},
                                                                           animationValueLessThan);
        if (it == keyValues.constBegin()) {
            //the item pointed to by it is the start element in the range
            if (it->first == 0 && keyValues.size() > 1) {
                currentInterval.start = *it;
                currentInterval.end = *(it+1);
            } else {
                currentInterval.start = {qreal(0), defaultStartEndValue};
                currentInterval.end = *it;
            }
        } else if (it == keyValues.constEnd()) {
            --it; //position the iterator on the last item
            if (it->first == 1 && keyValues.size() > 1) {
                //we have an end value (item with progress = 1)
                currentInterval.start = *(it-1);
                currentInterval.end = *it;
            } else {
                //we use the default end value here
                currentInterval.start = *it;
                currentInterval.end = {qreal(1), defaultStartEndValue};
            }
        } else {
            currentInterval.start = *(it-1);
            currentInterval.end = *it;
        }

        // update all the values of the currentInterval
        updateInterpolator();
    }
    setCurrentValueForProgress(progress);
}